

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5Tests.cpp
# Opt level: O1

int __thiscall glcts::GPUShader5Tests::init(GPUShader5Tests *this,EVP_PKEY_CTX *ctx)

{
  ExtParameters *extParams;
  int extraout_EAX;
  GPUShader5SamplerArrayIndexing *this_00;
  GPUShader5ImagesArrayIndexing *this_01;
  GPUShader5AtomicCountersArrayIndexing *this_02;
  GPUShader5UniformBlocksArrayIndexing *this_03;
  GPUShader5SSBOArrayIndexing *this_04;
  GPUShader5PreciseQualifier *this_05;
  GPUShader5FmaAccuracyTest *this_06;
  TestCaseBase *pTVar1;
  GPUShader5TextureGatherOffsetColor2DRepeatCaseTest *this_07;
  TestNode *pTVar2;
  GPUShader5TextureGatherOffsetColor2DOffsetsCaseTest *this_08;
  GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest *this_09;
  GPUShader5TextureGatherOffsetDepth2DOffsetsCaseTest *this_10;
  
  tcu::TestNode::init((TestNode *)this,ctx);
  this_00 = (GPUShader5SamplerArrayIndexing *)operator_new(0x2d8);
  extParams = &(this->super_TestCaseGroupBase).m_extParams;
  GPUShader5SamplerArrayIndexing::GPUShader5SamplerArrayIndexing
            (this_00,(this->super_TestCaseGroupBase).m_context,extParams,"sampler_array_indexing",
             "Test 1");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (GPUShader5ImagesArrayIndexing *)operator_new(0x2e0);
  GPUShader5ImagesArrayIndexing::GPUShader5ImagesArrayIndexing
            (this_01,(this->super_TestCaseGroupBase).m_context,extParams,"images_array_indexing",
             "Test 2");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (GPUShader5AtomicCountersArrayIndexing *)operator_new(0x2c0);
  GPUShader5AtomicCountersArrayIndexing::GPUShader5AtomicCountersArrayIndexing
            (this_02,(this->super_TestCaseGroupBase).m_context,extParams,
             "atomic_counters_array_indexing","Test 3");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (GPUShader5UniformBlocksArrayIndexing *)operator_new(0x2d0);
  GPUShader5UniformBlocksArrayIndexing::GPUShader5UniformBlocksArrayIndexing
            (this_03,(this->super_TestCaseGroupBase).m_context,extParams,
             "uniform_blocks_array_indexing","Test 4");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  if (10 < (int)this->m_glslVersion) {
    this_04 = (GPUShader5SSBOArrayIndexing *)operator_new(0x2c0);
    GPUShader5SSBOArrayIndexing::GPUShader5SSBOArrayIndexing
              (this_04,(this->super_TestCaseGroupBase).m_context,extParams,"ssbo_array_indexing",
               "Test 5");
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  }
  this_05 = (GPUShader5PreciseQualifier *)operator_new(0x2d0);
  GPUShader5PreciseQualifier::GPUShader5PreciseQualifier
            (this_05,(this->super_TestCaseGroupBase).m_context,extParams,"precise_qualifier",
             "Test 6");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
  this_06 = (GPUShader5FmaAccuracyTest *)operator_new(0x2d0);
  GPUShader5FmaAccuracyTest::GPUShader5FmaAccuracyTest
            (this_06,(this->super_TestCaseGroupBase).m_context,extParams,"fma_accuracy","Test 7");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_06);
  pTVar1 = (TestCaseBase *)operator_new(0x788);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,"fma_precision_float",
             "Test 8 float");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_021494a0
  ;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = 0x42c80000;
  pTVar1[2].m_glExtTokens.COMPRESSED_RGBA_ASTC_5x5 = 0;
  pTVar1[2].m_glExtTokens.COMPRESSED_RGBA_ASTC_6x5 = 0;
  pTVar1[2].m_glExtTokens.COMPRESSED_RGBA_ASTC_6x6 = 0;
  pTVar1[2].m_glExtTokens.COMPRESSED_RGBA_ASTC_8x5 = 0;
  pTVar1[2].m_glExtTokens.COMPRESSED_RGBA_ASTC_8x6 = 0;
  pTVar1[2].m_glExtTokens.COMPRESSED_RGBA_ASTC_8x8 = 0;
  pTVar1[2].m_glExtTokens.COMPRESSED_RGBA_ASTC_10x5 = 0;
  pTVar1[2].m_glExtTokens.COMPRESSED_RGBA_ASTC_10x6 = 0;
  pTVar1[2].m_glExtTokens.COMPRESSED_RGBA_ASTC_10x8 = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0xc38);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,"fma_precision_vec2",
             "Test 8 vec2");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_021494f0
  ;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = 0x42c80000;
  pTVar1[4].m_glExtTokens.PATCHES = 0;
  pTVar1[4].m_glExtTokens.MAX_PATCH_VERTICES = 0;
  pTVar1[4].m_glExtTokens.MAX_TESS_GEN_LEVEL = 0;
  pTVar1[4].m_glExtTokens.MAX_TESS_CONTROL_INPUT_COMPONENTS = 0;
  pTVar1[4].m_glExtTokens.MAX_TESS_CONTROL_OUTPUT_COMPONENTS = 0;
  pTVar1[4].m_glExtTokens.MAX_TESS_PATCH_COMPONENTS = 0;
  pTVar1[4].m_glExtTokens.MAX_TESS_EVALUATION_INPUT_COMPONENTS = 0;
  pTVar1[4].m_glExtTokens.MAX_TESS_EVALUATION_OUTPUT_COMPONENTS = 0;
  pTVar1[4].m_glExtTokens.MAX_TESS_EVALUATION_ATOMIC_COUNTERS = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x10e8);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,"fma_precision_vec3",
             "Test 8 vec3");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_02149540
  ;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = 0x42c80000;
  *(undefined8 *)
   ((long)&pTVar1[6].m_specializationMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right + 4)
       = 0;
  *(undefined8 *)
   ((long)&pTVar1[6].m_specializationMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 4) = 0;
  pTVar1[6].m_is_program_interface_query_supported = false;
  pTVar1[6].m_is_shader_image_load_store_supported = false;
  pTVar1[6].m_is_shader_image_atomic_supported = false;
  pTVar1[6].m_is_texture_storage_multisample_supported = false;
  pTVar1[6].m_is_texture_storage_multisample_2d_array_supported = false;
  pTVar1[6].m_is_tessellation_shader_supported = false;
  pTVar1[6].m_is_tessellation_shader_point_size_supported = false;
  pTVar1[6].m_is_texture_cube_map_array_supported = false;
  pTVar1[6].m_is_texture_border_clamp_supported = false;
  pTVar1[6].m_is_texture_buffer_supported = false;
  pTVar1[6].m_is_viewport_array_supported = false;
  pTVar1[6].field_0xbf = 0;
  pTVar1[6].m_glExtTokens.GEOMETRY_SHADER = 0;
  pTVar1[6].m_glExtTokens.GEOMETRY_SHADER_BIT = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x1598);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,"fma_precision_vec4",
             "Test 8 vec4");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_02149590
  ;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = 0x42c80000;
  pTVar1[7].m_glExtTokens.HSL_LUMINOSITY = 0;
  pTVar1[7].m_glExtTokens.PRIMITIVE_BOUNDING_BOX = 0;
  *(undefined8 *)&pTVar1[7].seed_value = 0;
  *(undefined8 *)((long)&pTVar1[8].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0;
  *(undefined8 *)((long)&pTVar1[8].super_TestCase.super_TestNode.m_testCtx + 4) = 0;
  *(undefined4 *)((long)&pTVar1[8].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  this_07 = (GPUShader5TextureGatherOffsetColor2DRepeatCaseTest *)operator_new(0x390);
  GPUShader5TextureGatherOffsetColor2DRepeatCaseTest::
  GPUShader5TextureGatherOffsetColor2DRepeatCaseTest
            (this_07,(this->super_TestCaseGroupBase).m_context,extParams,
             "texture_gather_offset_color_repeat","Test 9 - Color repeat case");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_07);
  pTVar2 = (TestNode *)operator_new(0x390);
  GPUShader5TextureGatherOffsetColor2DArrayCaseTest::
  GPUShader5TextureGatherOffsetColor2DArrayCaseTest
            ((GPUShader5TextureGatherOffsetColor2DArrayCaseTest *)pTVar2,
             (this->super_TestCaseGroupBase).m_context,extParams,"texture_gather_offset_color_array"
             ,"Test 9 - Color texture array case");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  this_08 = (GPUShader5TextureGatherOffsetColor2DOffsetsCaseTest *)operator_new(0x398);
  GPUShader5TextureGatherOffsetColor2DOffsetsCaseTest::
  GPUShader5TextureGatherOffsetColor2DOffsetsCaseTest
            (this_08,(this->super_TestCaseGroupBase).m_context,extParams,
             "texture_gather_offsets_color","Test 9 - Color offsets case");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_08);
  this_09 = (GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest *)operator_new(0x390);
  GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest::
  GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest
            (this_09,(this->super_TestCaseGroupBase).m_context,extParams,
             "texture_gather_offset_depth_repeat","Test 10 - Depth repeat case");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_09);
  pTVar2 = (TestNode *)operator_new(0x390);
  GPUShader5TextureGatherOffsetDepth2DRepeatYCaseTest::
  GPUShader5TextureGatherOffsetDepth2DRepeatYCaseTest
            ((GPUShader5TextureGatherOffsetDepth2DRepeatYCaseTest *)pTVar2,
             (this->super_TestCaseGroupBase).m_context,extParams,
             "texture_gather_offset_depth_repeat_y","Test 10 - Depth repeat, vertical case");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x390);
  GPUShader5TextureGatherOffsetDepth2DArrayCaseTest::
  GPUShader5TextureGatherOffsetDepth2DArrayCaseTest
            ((GPUShader5TextureGatherOffsetDepth2DArrayCaseTest *)pTVar2,
             (this->super_TestCaseGroupBase).m_context,extParams,"texture_gather_offset_depth_array"
             ,"Test 10 - Depth array case");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  this_10 = (GPUShader5TextureGatherOffsetDepth2DOffsetsCaseTest *)operator_new(0x398);
  GPUShader5TextureGatherOffsetDepth2DOffsetsCaseTest::
  GPUShader5TextureGatherOffsetDepth2DOffsetsCaseTest
            (this_10,(this->super_TestCaseGroupBase).m_context,extParams,
             "texture_gather_offsets_depth","Test 10 - Depth offsets case");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_10);
  pTVar2 = (TestNode *)operator_new(0x390);
  GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::
  GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest
            ((GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest *)pTVar2,
             (this->super_TestCaseGroupBase).m_context,extParams,
             "texture_gather_offset_color_clamp_to_border","Test 11 - Color clamp to border case");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x390);
  GPUShader5TextureGatherOffsetColor2DClampToEdgeCaseTest::
  GPUShader5TextureGatherOffsetColor2DClampToEdgeCaseTest
            ((GPUShader5TextureGatherOffsetColor2DClampToEdgeCaseTest *)pTVar2,
             (this->super_TestCaseGroupBase).m_context,extParams,
             "texture_gather_offset_color_clamp_to_edge","Test 11 - Color clamp to edge case");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x390);
  GPUShader5TextureGatherOffsetDepth2DClampToBorderCaseTest::
  GPUShader5TextureGatherOffsetDepth2DClampToBorderCaseTest
            ((GPUShader5TextureGatherOffsetDepth2DClampToBorderCaseTest *)pTVar2,
             (this->super_TestCaseGroupBase).m_context,extParams,
             "texture_gather_offset_depth_clamp_border","Test 11 - Depth clamp to border case");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x390);
  GPUShader5TextureGatherOffsetDepth2DClampToEdgeCaseTest::
  GPUShader5TextureGatherOffsetDepth2DClampToEdgeCaseTest
            ((GPUShader5TextureGatherOffsetDepth2DClampToEdgeCaseTest *)pTVar2,
             (this->super_TestCaseGroupBase).m_context,extParams,
             "texture_gather_offset_depth_clamp_edge","Test 11 - Depth clamp to edge case");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void GPUShader5Tests::init(void)
{
	/* Base class init */
	TestCaseGroupBase::init();

	/* Sampler Array Indexing (Test 1) */
	addChild(new GPUShader5SamplerArrayIndexing(m_context, m_extParams, "sampler_array_indexing", "Test 1"));

	/* Images Array Indexing (Test 2) */
	addChild(new GPUShader5ImagesArrayIndexing(m_context, m_extParams, "images_array_indexing", "Test 2"));

	/* Atomic Counters Array Indexing (Test 3) */
	addChild(
		new GPUShader5AtomicCountersArrayIndexing(m_context, m_extParams, "atomic_counters_array_indexing", "Test 3"));

	/* Uniform Blocks Array Indexing (Test 4) */
	addChild(
		new GPUShader5UniformBlocksArrayIndexing(m_context, m_extParams, "uniform_blocks_array_indexing", "Test 4"));

	if (m_glslVersion >= glu::GLSL_VERSION_430)
	{
		/* SSBO Array Indexing (Test 5) applicable only to OpenGL 4.x*/
		addChild(new GPUShader5SSBOArrayIndexing(m_context, m_extParams, "ssbo_array_indexing", "Test 5"));
	}

	/* GPUShader5 Precise Qualifier (Test 6) */
	addChild(new GPUShader5PreciseQualifier(m_context, m_extParams, "precise_qualifier", "Test 6"));

	/* Accuracy of the fma function (Test 7) */
	addChild(new GPUShader5FmaAccuracyTest(m_context, m_extParams, "fma_accuracy", "Test 7"));

	/* Uniform Blocks Array Indexing (Test 8) */
	addChild(new GPUShader5FmaPrecision<IDT_FLOAT>(m_context, m_extParams, "fma_precision_float", "Test 8 float"));
	addChild(new GPUShader5FmaPrecision<IDT_VEC2>(m_context, m_extParams, "fma_precision_vec2", "Test 8 vec2"));
	addChild(new GPUShader5FmaPrecision<IDT_VEC3>(m_context, m_extParams, "fma_precision_vec3", "Test 8 vec3"));
	addChild(new GPUShader5FmaPrecision<IDT_VEC4>(m_context, m_extParams, "fma_precision_vec4", "Test 8 vec4"));

	/* Texture gather offset (Tests 9, 10 and 11) */
	addChild(new GPUShader5TextureGatherOffsetColor2DRepeatCaseTest(
		m_context, m_extParams, "texture_gather_offset_color_repeat", "Test 9 - Color repeat case"));
	addChild(new GPUShader5TextureGatherOffsetColor2DArrayCaseTest(
		m_context, m_extParams, "texture_gather_offset_color_array", "Test 9 - Color texture array case"));
	addChild(new GPUShader5TextureGatherOffsetColor2DOffsetsCaseTest(
		m_context, m_extParams, "texture_gather_offsets_color", "Test 9 - Color offsets case"));
	addChild(new GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest(
		m_context, m_extParams, "texture_gather_offset_depth_repeat", "Test 10 - Depth repeat case"));
	addChild(new GPUShader5TextureGatherOffsetDepth2DRepeatYCaseTest(
		m_context, m_extParams, "texture_gather_offset_depth_repeat_y", "Test 10 - Depth repeat, vertical case"));
	addChild(new GPUShader5TextureGatherOffsetDepth2DArrayCaseTest(
		m_context, m_extParams, "texture_gather_offset_depth_array", "Test 10 - Depth array case"));
	addChild(new GPUShader5TextureGatherOffsetDepth2DOffsetsCaseTest(
		m_context, m_extParams, "texture_gather_offsets_depth", "Test 10 - Depth offsets case"));
	addChild(new GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest(
		m_context, m_extParams, "texture_gather_offset_color_clamp_to_border", "Test 11 - Color clamp to border case"));
	addChild(new GPUShader5TextureGatherOffsetColor2DClampToEdgeCaseTest(
		m_context, m_extParams, "texture_gather_offset_color_clamp_to_edge", "Test 11 - Color clamp to edge case"));
	addChild(new GPUShader5TextureGatherOffsetDepth2DClampToBorderCaseTest(
		m_context, m_extParams, "texture_gather_offset_depth_clamp_border", "Test 11 - Depth clamp to border case"));
	addChild(new GPUShader5TextureGatherOffsetDepth2DClampToEdgeCaseTest(
		m_context, m_extParams, "texture_gather_offset_depth_clamp_edge", "Test 11 - Depth clamp to edge case"));
}